

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ExpressionValue * __thiscall
ExpressionValue::operator&(ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValue *result;
  ExpressionValue *in_RDI;
  
  (in_RDI->strValue)._value._M_dataplus._M_p = (pointer)&(in_RDI->strValue)._value.field_2;
  (in_RDI->strValue)._value._M_string_length = 0;
  (in_RDI->strValue)._value.field_2._M_local_buf[0] = '\0';
  in_RDI->type = Invalid;
  (in_RDI->field_1).intValue = 0;
  if ((this->type << 2 | other->type) == 5) {
    in_RDI->type = Integer;
    (in_RDI->field_1).intValue = (other->field_1).intValue & (this->field_1).intValue;
  }
  return in_RDI;
}

Assistant:

ExpressionValue ExpressionValue::operator&(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = intValue & other.intValue;
		break;
	default:
		break;
	}

	return result;
}